

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int ecdh_sha2_nistp(LIBSSH2_SESSION *session,libssh2_curve_type type,uchar *data,size_t data_len,
                   uchar *public_key,size_t public_key_len,EC_KEY *private_key,
                   kmdhgGPshakex_state_t *exchange_state)

{
  uchar **data_00;
  void **ppvVar1;
  EVP_MD_CTX *pEVar2;
  kmdhgGPshakex_state_t *pkVar3;
  kmdhgGPshakex_state_t *pkVar4;
  int iVar5;
  uint uVar6;
  BIGNUM *pBVar7;
  size_t sVar8;
  LIBSSH2_HOSTKEY_METHOD *pLVar9;
  uchar *puVar10;
  LIBSSH2_CRYPT_METHOD *pLVar11;
  uchar *puVar12;
  _LIBSSH2_MAC_METHOD *p_Var13;
  LIBSSH2_COMP_METHOD *pLVar14;
  char *pcVar15;
  ulong uVar16;
  uchar *puVar17;
  uchar *puVar18;
  EVP_MD_CTX *pEVar19;
  ulong uVar20;
  long lVar21;
  size_t sVar22;
  size_t sVar23;
  EVP_MD_CTX *fingerprint_ctx;
  kmdhgGPshakex_state_t *local_78;
  EVP_MD_CTX *hash;
  uchar *local_68;
  size_t local_60;
  libssh2_curve_type local_54;
  size_t server_public_key_len;
  uchar *local_48;
  uchar *server_public_key;
  void **local_38;
  
  if (data_len < 5) {
    iVar5 = _libssh2_error(session,-10,"Host key data is too short");
    return iVar5;
  }
  local_78 = exchange_state;
  iVar5 = 0;
  local_54 = type;
  switch(exchange_state->state) {
  case libssh2_NB_state_idle:
    pBVar7 = BN_new();
    local_78->k = (BIGNUM *)pBVar7;
    local_78->state = libssh2_NB_state_created;
    break;
  default:
    goto switchD_001147f1_caseD_1;
  case libssh2_NB_state_created:
    break;
  case libssh2_NB_state_sent:
    goto switchD_001147f1_caseD_3;
  case libssh2_NB_state_sent2:
    goto switchD_001147f1_caseD_5;
  }
  local_68 = data + 1;
  hash = (EVP_MD_CTX *)data;
  local_60 = data_len;
  local_48 = (uchar *)public_key_len;
  iVar5 = _libssh2_copy_string
                    (session,(string_buf *)&hash,&session->server_hostkey,&server_public_key_len);
  if (iVar5 == 0) {
    session->server_hostkey_len = (uint32_t)server_public_key_len;
    iVar5 = _libssh2_md5_init(&fingerprint_ctx);
    if (iVar5 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_md5,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_md5_valid = (uint)(iVar5 != 0);
    iVar5 = _libssh2_sha1_init(&fingerprint_ctx);
    if (iVar5 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_sha1,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_sha1_valid = (uint)(iVar5 != 0);
    iVar5 = _libssh2_sha256_init(&fingerprint_ctx);
    if (iVar5 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_sha256,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_sha256_valid = (uint)(iVar5 != 0);
    ppvVar1 = &session->server_hostkey_abstract;
    iVar5 = (*session->hostkey->init)
                      (session,session->server_hostkey,(ulong)session->server_hostkey_len,ppvVar1);
    if (iVar5 == 0) {
      iVar5 = _libssh2_get_string((string_buf *)&hash,&server_public_key,&server_public_key_len);
      pkVar3 = local_78;
      if (iVar5 == 0) {
        iVar5 = _libssh2_get_string((string_buf *)&hash,&local_78->h_sig,&local_78->h_sig_len);
        if (iVar5 != 0) {
          pcVar15 = "Unexpected ECDH server sig length";
          goto LAB_00114979;
        }
        iVar5 = _libssh2_ecdh_gen_k(&pkVar3->k,private_key,
                                    (uchar *)CONCAT44(server_public_key._4_4_,(int)server_public_key
                                                     ),
                                    CONCAT44(server_public_key_len._4_4_,
                                             (uint32_t)server_public_key_len));
        if (iVar5 == 0) {
          iVar5 = BN_num_bits((BIGNUM *)pkVar3->k);
          pkVar3->k_value_len = (long)((iVar5 + 7) / 8 + 5);
          uVar6 = BN_num_bits((BIGNUM *)pkVar3->k);
          sVar23 = pkVar3->k_value_len;
          if ((uVar6 & 7) != 0) {
            sVar23 = sVar23 - 1;
            pkVar3->k_value_len = sVar23;
          }
          puVar10 = (uchar *)(*session->alloc)(sVar23,&session->abstract);
          pkVar3->k_value = puVar10;
          if (puVar10 == (uchar *)0x0) {
            pcVar15 = "Unable to allocate buffer for ECDH K";
            goto LAB_00114847;
          }
          _libssh2_htonu32(puVar10,(int)pkVar3->k_value_len - 4);
          uVar6 = BN_num_bits((BIGNUM *)pkVar3->k);
          if ((uVar6 & 7) == 0) {
            local_78->k_value[4] = '\0';
            lVar21 = 5;
          }
          else {
            lVar21 = 4;
          }
          BN_bn2bin((BIGNUM *)local_78->k,local_78->k_value + lVar21);
          pkVar3 = local_78;
          if (local_54 == LIBSSH2_EC_CURVE_NISTP521) {
            local_78->exchange_hash = &fingerprint_ctx;
            _libssh2_sha512_init(&fingerprint_ctx);
            puVar12 = (session->local).banner;
            puVar10 = pkVar3->h_sig_comp;
            if (puVar12 == (uchar *)0x0) {
              local_38 = ppvVar1;
              _libssh2_htonu32(puVar10,0x16);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              pcVar15 = "SSH-2.0-libssh2_1.11.0";
              sVar8 = 0x16;
              pEVar19 = (EVP_MD_CTX *)fingerprint_ctx;
            }
            else {
              local_38 = ppvVar1;
              sVar8 = strlen((char *)puVar12);
              _libssh2_htonu32(puVar10,(int)sVar8 - 2);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              pEVar19 = (EVP_MD_CTX *)fingerprint_ctx;
              pcVar15 = (char *)(session->local).banner;
              sVar8 = strlen(pcVar15);
              sVar8 = sVar8 - 2;
            }
            EVP_DigestUpdate(pEVar19,pcVar15,sVar8);
            sVar8 = strlen((char *)(session->remote).banner);
            _libssh2_htonu32(puVar10,(uint32_t)sVar8);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
            pEVar2 = fingerprint_ctx;
            puVar12 = (session->remote).banner;
            sVar8 = strlen((char *)puVar12);
            EVP_DigestUpdate((EVP_MD_CTX *)pEVar2,puVar12,sVar8);
            _libssh2_htonu32(puVar10,(uint32_t)(session->local).kexinit_len);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->local).kexinit,
                             (session->local).kexinit_len);
            _libssh2_htonu32(puVar10,(uint32_t)(session->remote).kexinit_len);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->remote).kexinit,
                             (session->remote).kexinit_len);
            _libssh2_htonu32(puVar10,session->server_hostkey_len);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                             (ulong)session->server_hostkey_len);
            puVar12 = local_48;
            _libssh2_htonu32(puVar10,(uint32_t)local_48);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,public_key,(size_t)puVar12);
            _libssh2_htonu32(puVar10,(uint32_t)server_public_key_len);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,
                             (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                             CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
            pkVar4 = local_78;
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,local_78->k_value,local_78->k_value_len);
            EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar10,(uint *)0x0);
            EVP_MD_CTX_free(fingerprint_ctx);
            pLVar9 = session->hostkey;
            puVar10 = pkVar4->h_sig;
            sVar23 = pkVar4->h_sig_len;
            sVar22 = 0x40;
LAB_00115180:
            iVar5 = (*pLVar9->sig_verify)(session,puVar10,sVar23,pkVar3->h_sig_comp,sVar22,local_38)
            ;
            if (iVar5 != 0) {
              pcVar15 = "Unable to verify hostkey signature ECDH";
              iVar5 = -0xb;
              goto LAB_001154fc;
            }
          }
          else {
            if (local_54 == LIBSSH2_EC_CURVE_NISTP384) {
              local_78->exchange_hash = &fingerprint_ctx;
              _libssh2_sha384_init(&fingerprint_ctx);
              puVar12 = (session->local).banner;
              puVar10 = pkVar3->h_sig_comp;
              if (puVar12 == (uchar *)0x0) {
                local_38 = ppvVar1;
                _libssh2_htonu32(puVar10,0x16);
                EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
                pcVar15 = "SSH-2.0-libssh2_1.11.0";
                sVar8 = 0x16;
                pEVar19 = (EVP_MD_CTX *)fingerprint_ctx;
              }
              else {
                local_38 = ppvVar1;
                sVar8 = strlen((char *)puVar12);
                _libssh2_htonu32(puVar10,(int)sVar8 - 2);
                EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
                pEVar19 = (EVP_MD_CTX *)fingerprint_ctx;
                pcVar15 = (char *)(session->local).banner;
                sVar8 = strlen(pcVar15);
                sVar8 = sVar8 - 2;
              }
              EVP_DigestUpdate(pEVar19,pcVar15,sVar8);
              sVar8 = strlen((char *)(session->remote).banner);
              _libssh2_htonu32(puVar10,(uint32_t)sVar8);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              pEVar2 = fingerprint_ctx;
              puVar12 = (session->remote).banner;
              sVar8 = strlen((char *)puVar12);
              EVP_DigestUpdate((EVP_MD_CTX *)pEVar2,puVar12,sVar8);
              _libssh2_htonu32(puVar10,(uint32_t)(session->local).kexinit_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->local).kexinit,
                               (session->local).kexinit_len);
              _libssh2_htonu32(puVar10,(uint32_t)(session->remote).kexinit_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->remote).kexinit,
                               (session->remote).kexinit_len);
              _libssh2_htonu32(puVar10,session->server_hostkey_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                               (ulong)session->server_hostkey_len);
              puVar12 = local_48;
              _libssh2_htonu32(puVar10,(uint32_t)local_48);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,public_key,(size_t)puVar12);
              _libssh2_htonu32(puVar10,(uint32_t)server_public_key_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,
                               (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                               CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len)
                              );
              pkVar4 = local_78;
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,local_78->k_value,local_78->k_value_len
                              );
              EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar10,(uint *)0x0);
              EVP_MD_CTX_free(fingerprint_ctx);
              pLVar9 = session->hostkey;
              puVar10 = pkVar4->h_sig;
              sVar23 = pkVar4->h_sig_len;
              sVar22 = 0x30;
              goto LAB_00115180;
            }
            if (local_54 == LIBSSH2_EC_CURVE_NISTP256) {
              local_78->exchange_hash = &fingerprint_ctx;
              _libssh2_sha256_init(&fingerprint_ctx);
              puVar12 = (session->local).banner;
              puVar10 = pkVar3->h_sig_comp;
              if (puVar12 == (uchar *)0x0) {
                local_38 = ppvVar1;
                _libssh2_htonu32(puVar10,0x16);
                EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
                pcVar15 = "SSH-2.0-libssh2_1.11.0";
                sVar8 = 0x16;
                pEVar19 = (EVP_MD_CTX *)fingerprint_ctx;
              }
              else {
                local_38 = ppvVar1;
                sVar8 = strlen((char *)puVar12);
                _libssh2_htonu32(puVar10,(int)sVar8 - 2);
                EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
                pEVar19 = (EVP_MD_CTX *)fingerprint_ctx;
                pcVar15 = (char *)(session->local).banner;
                sVar8 = strlen(pcVar15);
                sVar8 = sVar8 - 2;
              }
              EVP_DigestUpdate(pEVar19,pcVar15,sVar8);
              sVar8 = strlen((char *)(session->remote).banner);
              _libssh2_htonu32(puVar10,(uint32_t)sVar8);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              pEVar2 = fingerprint_ctx;
              puVar12 = (session->remote).banner;
              sVar8 = strlen((char *)puVar12);
              EVP_DigestUpdate((EVP_MD_CTX *)pEVar2,puVar12,sVar8);
              _libssh2_htonu32(puVar10,(uint32_t)(session->local).kexinit_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->local).kexinit,
                               (session->local).kexinit_len);
              _libssh2_htonu32(puVar10,(uint32_t)(session->remote).kexinit_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(session->remote).kexinit,
                               (session->remote).kexinit_len);
              _libssh2_htonu32(puVar10,session->server_hostkey_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                               (ulong)session->server_hostkey_len);
              puVar12 = local_48;
              _libssh2_htonu32(puVar10,(uint32_t)local_48);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,public_key,(size_t)puVar12);
              _libssh2_htonu32(puVar10,(uint32_t)server_public_key_len);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar10,4);
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,
                               (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                               CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len)
                              );
              pkVar4 = local_78;
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,local_78->k_value,local_78->k_value_len
                              );
              EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar10,(uint *)0x0);
              EVP_MD_CTX_free(fingerprint_ctx);
              pLVar9 = session->hostkey;
              puVar10 = pkVar4->h_sig;
              sVar23 = pkVar4->h_sig_len;
              sVar22 = 0x20;
              goto LAB_00115180;
            }
          }
          local_78->c = '\x15';
          local_78->state = libssh2_NB_state_sent;
switchD_001147f1_caseD_3:
          pkVar3 = local_78;
          iVar5 = _libssh2_transport_send(session,&local_78->c,1,(uchar *)0x0,0);
          if (iVar5 == -0x25) {
            return -0x25;
          }
          if (iVar5 == 0) {
            pkVar3->state = libssh2_NB_state_sent2;
switchD_001147f1_caseD_5:
            pkVar3 = local_78;
            data_00 = &local_78->tmp;
            iVar5 = _libssh2_packet_require
                              (session,'\x15',data_00,&local_78->tmp_len,0,(uchar *)0x0,0,
                               &local_78->req_state);
            if (iVar5 == -0x25) {
              return -0x25;
            }
            if (iVar5 == 0) {
              *(byte *)&session->state = (byte)session->state | 2;
              (*session->free)(*data_00,&session->abstract);
              if (session->session_id == (uchar *)0x0) {
                if (local_54 == LIBSSH2_EC_CURVE_NISTP256) {
                  sVar23 = 0x20;
                }
                else if (local_54 == LIBSSH2_EC_CURVE_NISTP521) {
                  sVar23 = 0x40;
                }
                else {
                  if (local_54 != LIBSSH2_EC_CURVE_NISTP384) {
                    pcVar15 = "Unknown SHA digest for EC curve";
                    goto LAB_001154f6;
                  }
                  sVar23 = 0x30;
                }
                puVar10 = (uchar *)(*session->alloc)(sVar23,&session->abstract);
                session->session_id = puVar10;
                if (puVar10 == (uchar *)0x0) {
                  pcVar15 = "Unable to allocate buffer for SHA digest";
                  goto LAB_00114847;
                }
                memcpy(puVar10,pkVar3->h_sig_comp,sVar23);
                session->session_id_len = (uint32_t)sVar23;
              }
              pLVar11 = (session->local).crypt;
              if (pLVar11->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                (*pLVar11->dtor)(session,&(session->local).crypt_abstract);
                pLVar11 = (session->local).crypt;
              }
              if (pLVar11->init ==
                  (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                   *)0x0) {
LAB_00115975:
                pLVar11 = (session->remote).crypt;
                if (pLVar11->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                  (*pLVar11->dtor)(session,&(session->remote).crypt_abstract);
                  pLVar11 = (session->remote).crypt;
                }
                if (pLVar11->init ==
                    (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                     *)0x0) {
LAB_00115f95:
                  p_Var13 = (session->local).mac;
                  if (p_Var13->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*p_Var13->dtor)(session,&(session->local).mac_abstract);
                    p_Var13 = (session->local).mac;
                  }
                  if (p_Var13->init !=
                      (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                    server_public_key._0_4_ = 0;
                    if (local_54 == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar10 = (uchar *)(*session->alloc)((long)p_Var13->key_len + 0x40,
                                                           &session->abstract);
                      if (puVar10 != (uchar *)0x0) {
                        puVar12 = local_78->h_sig_comp;
                        for (uVar20 = 0; uVar20 < (ulong)(long)((session->local).mac)->key_len;
                            uVar20 = uVar20 + 0x40) {
                          _libssh2_sha512_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,
                                           local_78->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar12,0x40);
                          uVar16 = uVar20;
                          puVar18 = puVar10;
                          if (uVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
                            uVar16 = (ulong)session->session_id_len;
                            puVar18 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                        }
                      }
                    }
                    else if (local_54 == LIBSSH2_EC_CURVE_NISTP384) {
                      puVar10 = (uchar *)(*session->alloc)((long)p_Var13->key_len + 0x30,
                                                           &session->abstract);
                      if (puVar10 != (uchar *)0x0) {
                        puVar12 = local_78->h_sig_comp;
                        for (uVar20 = 0; uVar20 < (ulong)(long)((session->local).mac)->key_len;
                            uVar20 = uVar20 + 0x30) {
                          _libssh2_sha384_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,
                                           local_78->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar12,0x30);
                          uVar16 = uVar20;
                          puVar18 = puVar10;
                          if (uVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
                            uVar16 = (ulong)session->session_id_len;
                            puVar18 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                        }
                      }
                    }
                    else {
                      if (local_54 != LIBSSH2_EC_CURVE_NISTP256) goto LAB_00115f46;
                      puVar10 = (uchar *)(*session->alloc)((long)p_Var13->key_len + 0x20,
                                                           &session->abstract);
                      if (puVar10 != (uchar *)0x0) {
                        puVar12 = local_78->h_sig_comp;
                        for (uVar20 = 0; uVar20 < (ulong)(long)((session->local).mac)->key_len;
                            uVar20 = uVar20 + 0x20) {
                          _libssh2_sha256_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,
                                           local_78->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar12,0x20);
                          uVar16 = uVar20;
                          puVar18 = puVar10;
                          if (uVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
                            uVar16 = (ulong)session->session_id_len;
                            puVar18 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                        }
                      }
                    }
                    if (puVar10 == (uchar *)0x0) goto LAB_00115f46;
                    (*((session->local).mac)->init)
                              (session,puVar10,(int *)&server_public_key,
                               &(session->local).mac_abstract);
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar10,(long)((session->local).mac)->key_len);
                      (*session->free)(puVar10,&session->abstract);
                    }
                  }
                  p_Var13 = (session->remote).mac;
                  if (p_Var13->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*p_Var13->dtor)(session,&(session->remote).mac_abstract);
                    p_Var13 = (session->remote).mac;
                  }
                  if (p_Var13->init !=
                      (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                    server_public_key._0_4_ = 0;
                    if (local_54 == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar10 = (uchar *)(*session->alloc)((long)p_Var13->key_len + 0x40,
                                                           &session->abstract);
                      if (puVar10 != (uchar *)0x0) {
                        puVar12 = local_78->h_sig_comp;
                        for (uVar20 = 0; uVar20 < (ulong)(long)((session->remote).mac)->key_len;
                            uVar20 = uVar20 + 0x40) {
                          _libssh2_sha512_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,
                                           local_78->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar12,0x40);
                          uVar16 = uVar20;
                          puVar18 = puVar10;
                          if (uVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
                            uVar16 = (ulong)session->session_id_len;
                            puVar18 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                        }
                      }
                    }
                    else if (local_54 == LIBSSH2_EC_CURVE_NISTP384) {
                      puVar10 = (uchar *)(*session->alloc)((long)p_Var13->key_len + 0x30,
                                                           &session->abstract);
                      if (puVar10 != (uchar *)0x0) {
                        puVar12 = local_78->h_sig_comp;
                        for (uVar20 = 0; uVar20 < (ulong)(long)((session->remote).mac)->key_len;
                            uVar20 = uVar20 + 0x30) {
                          _libssh2_sha384_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,
                                           local_78->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar12,0x30);
                          uVar16 = uVar20;
                          puVar18 = puVar10;
                          if (uVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
                            uVar16 = (ulong)session->session_id_len;
                            puVar18 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                        }
                      }
                    }
                    else {
                      if (local_54 != LIBSSH2_EC_CURVE_NISTP256) goto LAB_00115f46;
                      puVar10 = (uchar *)(*session->alloc)((long)p_Var13->key_len + 0x20,
                                                           &session->abstract);
                      if (puVar10 != (uchar *)0x0) {
                        puVar12 = local_78->h_sig_comp;
                        for (uVar20 = 0; uVar20 < (ulong)(long)((session->remote).mac)->key_len;
                            uVar20 = uVar20 + 0x20) {
                          _libssh2_sha256_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,
                                           local_78->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar12,0x20);
                          uVar16 = uVar20;
                          puVar18 = puVar10;
                          if (uVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
                            uVar16 = (ulong)session->session_id_len;
                            puVar18 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                        }
                      }
                    }
                    if (puVar10 == (uchar *)0x0) goto LAB_00115f46;
                    (*((session->remote).mac)->init)
                              (session,puVar10,(int *)&server_public_key,
                               &(session->remote).mac_abstract);
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar10,(long)((session->remote).mac)->key_len);
                      (*session->free)(puVar10,&session->abstract);
                    }
                  }
                  pLVar14 = (session->local).comp;
                  if (pLVar14 != (LIBSSH2_COMP_METHOD *)0x0) {
                    if (pLVar14->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      (*pLVar14->dtor)(session,1,&(session->local).comp_abstract);
                      pLVar14 = (session->local).comp;
                      if (pLVar14 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_0011661b;
                    }
                    if ((pLVar14->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) &&
                       (iVar5 = (*pLVar14->init)(session,1,&(session->local).comp_abstract),
                       iVar5 != 0)) goto LAB_00115f46;
                  }
LAB_0011661b:
                  pLVar14 = (session->remote).comp;
                  iVar5 = 0;
                  if (pLVar14 != (LIBSSH2_COMP_METHOD *)0x0) {
                    if (pLVar14->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      iVar5 = 0;
                      (*pLVar14->dtor)(session,0,&(session->remote).comp_abstract);
                      pLVar14 = (session->remote).comp;
                      if (pLVar14 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_001147f1_caseD_1;
                    }
                    iVar5 = 0;
                    if (pLVar14->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      iVar5 = (*pLVar14->init)(session,0,&(session->remote).comp_abstract);
                      iVar5 = (uint)(iVar5 == 0) * 5 + -5;
                    }
                  }
                  goto switchD_001147f1_caseD_1;
                }
                server_public_key._0_4_ = 0;
                server_public_key_len._0_4_ = 0;
                if (local_54 == LIBSSH2_EC_CURVE_NISTP256) {
                  puVar12 = (uchar *)(*session->alloc)((long)pLVar11->iv_len + 0x20,
                                                       &session->abstract);
                  if (puVar12 != (uchar *)0x0) {
                    puVar10 = local_78->h_sig_comp;
                    for (uVar20 = 0; uVar20 < (ulong)(long)((session->remote).crypt)->iv_len;
                        uVar20 = uVar20 + 0x20) {
                      _libssh2_sha256_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,local_78->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar10,0x20);
                      uVar16 = uVar20;
                      puVar18 = puVar12;
                      if (uVar20 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
                        uVar16 = (ulong)session->session_id_len;
                        puVar18 = session->session_id;
                      }
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + uVar20,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                    }
                  }
LAB_00115c4b:
                  if (puVar12 != (uchar *)0x0) {
                    if (local_54 == LIBSSH2_EC_CURVE_NISTP256) {
                      puVar10 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                 secret_len + 0x20,
                                                           &session->abstract);
                      if (puVar10 != (uchar *)0x0) {
                        puVar18 = local_78->h_sig_comp;
                        for (uVar20 = 0; uVar20 < (ulong)(long)((session->remote).crypt)->secret_len
                            ; uVar20 = uVar20 + 0x20) {
                          _libssh2_sha256_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,
                                           local_78->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,0x20);
                          uVar16 = uVar20;
                          puVar17 = puVar10;
                          if (uVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
                            uVar16 = (ulong)session->session_id_len;
                            puVar17 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar16);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                        }
                      }
                    }
                    else if (local_54 == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar10 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                 secret_len + 0x40,
                                                           &session->abstract);
                      if (puVar10 != (uchar *)0x0) {
                        puVar18 = local_78->h_sig_comp;
                        for (uVar20 = 0; uVar20 < (ulong)(long)((session->remote).crypt)->secret_len
                            ; uVar20 = uVar20 + 0x40) {
                          _libssh2_sha512_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,
                                           local_78->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,0x40);
                          uVar16 = uVar20;
                          puVar17 = puVar10;
                          if (uVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
                            uVar16 = (ulong)session->session_id_len;
                            puVar17 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar16);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                        }
                      }
                    }
                    else {
                      if (local_54 != LIBSSH2_EC_CURVE_NISTP384) goto LAB_00115f3d;
                      puVar10 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                 secret_len + 0x30,
                                                           &session->abstract);
                      if (puVar10 != (uchar *)0x0) {
                        puVar18 = local_78->h_sig_comp;
                        for (uVar20 = 0; uVar20 < (ulong)(long)((session->remote).crypt)->secret_len
                            ; uVar20 = uVar20 + 0x30) {
                          _libssh2_sha384_init(&hash);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,
                                           local_78->k_value_len);
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,0x30);
                          uVar16 = uVar20;
                          puVar17 = puVar10;
                          if (uVar20 == 0) {
                            EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
                            uVar16 = (ulong)session->session_id_len;
                            puVar17 = session->session_id;
                          }
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar17,uVar16);
                          EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                          EVP_MD_CTX_free(hash);
                        }
                      }
                    }
                    if (puVar10 == (uchar *)0x0) goto LAB_00115f3d;
                    pLVar11 = (session->remote).crypt;
                    iVar5 = (*pLVar11->init)(session,pLVar11,puVar12,(int *)&server_public_key,
                                             puVar10,(int *)&server_public_key_len,0,
                                             &(session->remote).crypt_abstract);
                    if (iVar5 != 0) goto LAB_00115f2f;
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar12,(long)((session->remote).crypt)->iv_len);
                      (*session->free)(puVar12,&session->abstract);
                    }
                    if ((uint32_t)server_public_key_len != 0) {
                      explicit_bzero(puVar10,(long)((session->remote).crypt)->secret_len);
                      (*session->free)(puVar10,&session->abstract);
                    }
                    goto LAB_00115f95;
                  }
                }
                else {
                  if (local_54 == LIBSSH2_EC_CURVE_NISTP521) {
                    puVar12 = (uchar *)(*session->alloc)((long)pLVar11->iv_len + 0x40,
                                                         &session->abstract);
                    if (puVar12 != (uchar *)0x0) {
                      puVar10 = local_78->h_sig_comp;
                      for (uVar20 = 0; uVar20 < (ulong)(long)((session->remote).crypt)->iv_len;
                          uVar20 = uVar20 + 0x40) {
                        _libssh2_sha512_init(&hash);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,local_78->k_value_len)
                        ;
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar10,0x40);
                        uVar16 = uVar20;
                        puVar18 = puVar12;
                        if (uVar20 == 0) {
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
                          uVar16 = (ulong)session->session_id_len;
                          puVar18 = session->session_id;
                        }
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                        EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + uVar20,(uint *)0x0);
                        EVP_MD_CTX_free(hash);
                      }
                    }
                    goto LAB_00115c4b;
                  }
                  if (local_54 == LIBSSH2_EC_CURVE_NISTP384) {
                    puVar12 = (uchar *)(*session->alloc)((long)pLVar11->iv_len + 0x30,
                                                         &session->abstract);
                    if (puVar12 != (uchar *)0x0) {
                      puVar10 = local_78->h_sig_comp;
                      for (uVar20 = 0; uVar20 < (ulong)(long)((session->remote).crypt)->iv_len;
                          uVar20 = uVar20 + 0x30) {
                        _libssh2_sha384_init(&hash);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,local_78->k_value_len)
                        ;
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar10,0x30);
                        uVar16 = uVar20;
                        puVar18 = puVar12;
                        if (uVar20 == 0) {
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
                          uVar16 = (ulong)session->session_id_len;
                          puVar18 = session->session_id;
                        }
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                        EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + uVar20,(uint *)0x0);
                        EVP_MD_CTX_free(hash);
                      }
                    }
                    goto LAB_00115c4b;
                  }
                }
              }
              else {
                server_public_key._0_4_ = 0;
                server_public_key_len._0_4_ = 0;
                iVar5 = -1;
                if (local_54 == LIBSSH2_EC_CURVE_NISTP256) {
                  local_48 = (uchar *)(*session->alloc)((long)pLVar11->iv_len + 0x20,
                                                        &session->abstract);
                  if (local_48 != (uchar *)0x0) {
                    puVar10 = local_78->h_sig_comp;
                    for (uVar20 = 0; uVar20 < (ulong)(long)((session->local).crypt)->iv_len;
                        uVar20 = uVar20 + 0x20) {
                      _libssh2_sha256_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,local_78->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar10,0x20);
                      puVar12 = local_48;
                      if (uVar20 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,session->session_id,
                                         (ulong)session->session_id_len);
                        puVar12 = local_48;
                      }
                      else {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,local_48,uVar20);
                      }
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + uVar20,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                    }
                  }
                }
                else if (local_54 == LIBSSH2_EC_CURVE_NISTP521) {
                  local_48 = (uchar *)(*session->alloc)((long)pLVar11->iv_len + 0x40,
                                                        &session->abstract);
                  if (local_48 != (uchar *)0x0) {
                    puVar10 = local_78->h_sig_comp;
                    for (uVar20 = 0; uVar20 < (ulong)(long)((session->local).crypt)->iv_len;
                        uVar20 = uVar20 + 0x40) {
                      _libssh2_sha512_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,local_78->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar10,0x40);
                      puVar12 = local_48;
                      if (uVar20 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,session->session_id,
                                         (ulong)session->session_id_len);
                        puVar12 = local_48;
                      }
                      else {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,local_48,uVar20);
                      }
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + uVar20,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                    }
                  }
                }
                else {
                  if (local_54 != LIBSSH2_EC_CURVE_NISTP384) goto switchD_001147f1_caseD_1;
                  local_48 = (uchar *)(*session->alloc)((long)pLVar11->iv_len + 0x30,
                                                        &session->abstract);
                  if (local_48 != (uchar *)0x0) {
                    puVar10 = local_78->h_sig_comp;
                    for (uVar20 = 0; uVar20 < (ulong)(long)((session->local).crypt)->iv_len;
                        uVar20 = uVar20 + 0x30) {
                      _libssh2_sha384_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,local_78->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar10,0x30);
                      puVar12 = local_48;
                      if (uVar20 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,session->session_id,
                                         (ulong)session->session_id_len);
                        puVar12 = local_48;
                      }
                      else {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,local_48,uVar20);
                      }
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar12 + uVar20,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                    }
                  }
                }
                if (local_48 == (uchar *)0x0) goto switchD_001147f1_caseD_1;
                if (local_54 == LIBSSH2_EC_CURVE_NISTP256) {
                  puVar10 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len +
                                                       0x20,&session->abstract);
                  if (puVar10 != (uchar *)0x0) {
                    puVar12 = local_78->h_sig_comp;
                    for (uVar20 = 0; uVar20 < (ulong)(long)((session->local).crypt)->secret_len;
                        uVar20 = uVar20 + 0x20) {
                      _libssh2_sha256_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,local_78->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar12,0x20);
                      uVar16 = uVar20;
                      puVar18 = puVar10;
                      if (uVar20 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
                        uVar16 = (ulong)session->session_id_len;
                        puVar18 = session->session_id;
                      }
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                    }
                  }
LAB_001158ee:
                  puVar12 = local_48;
                  if (puVar10 != (uchar *)0x0) {
                    pLVar11 = (session->local).crypt;
                    iVar5 = (*pLVar11->init)(session,pLVar11,local_48,(int *)&server_public_key,
                                             puVar10,(int *)&server_public_key_len,1,
                                             &(session->local).crypt_abstract);
                    if (iVar5 == 0) {
                      if ((int)server_public_key != 0) {
                        explicit_bzero(puVar12,(long)((session->local).crypt)->iv_len);
                        (*session->free)(puVar12,&session->abstract);
                      }
                      if ((uint32_t)server_public_key_len != 0) {
                        explicit_bzero(puVar10,(long)((session->local).crypt)->secret_len);
                        (*session->free)(puVar10,&session->abstract);
                      }
                      goto LAB_00115975;
                    }
LAB_00115f2f:
                    (*session->free)(puVar12,&session->abstract);
                    puVar12 = puVar10;
                  }
                }
                else {
                  if (local_54 == LIBSSH2_EC_CURVE_NISTP521) {
                    puVar10 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len
                                                         + 0x40,&session->abstract);
                    if (puVar10 != (uchar *)0x0) {
                      puVar12 = local_78->h_sig_comp;
                      for (uVar20 = 0; uVar20 < (ulong)(long)((session->local).crypt)->secret_len;
                          uVar20 = uVar20 + 0x40) {
                        _libssh2_sha512_init(&hash);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,local_78->k_value_len)
                        ;
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar12,0x40);
                        uVar16 = uVar20;
                        puVar18 = puVar10;
                        if (uVar20 == 0) {
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
                          uVar16 = (ulong)session->session_id_len;
                          puVar18 = session->session_id;
                        }
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                        EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                        EVP_MD_CTX_free(hash);
                      }
                    }
                    goto LAB_001158ee;
                  }
                  puVar12 = local_48;
                  if (local_54 == LIBSSH2_EC_CURVE_NISTP384) {
                    puVar10 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len
                                                         + 0x30,&session->abstract);
                    if (puVar10 != (uchar *)0x0) {
                      puVar12 = local_78->h_sig_comp;
                      for (uVar20 = 0; uVar20 < (ulong)(long)((session->local).crypt)->secret_len;
                          uVar20 = uVar20 + 0x30) {
                        _libssh2_sha384_init(&hash);
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,local_78->k_value,local_78->k_value_len)
                        ;
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar12,0x30);
                        uVar16 = uVar20;
                        puVar18 = puVar10;
                        if (uVar20 == 0) {
                          EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
                          uVar16 = (ulong)session->session_id_len;
                          puVar18 = session->session_id;
                        }
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar18,uVar16);
                        EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + uVar20,(uint *)0x0);
                        EVP_MD_CTX_free(hash);
                      }
                    }
                    goto LAB_001158ee;
                  }
                }
LAB_00115f3d:
                (*session->free)(puVar12,&session->abstract);
              }
LAB_00115f46:
              iVar5 = -5;
              goto switchD_001147f1_caseD_1;
            }
            pcVar15 = "Timed out waiting for NEWKEYS ECDH";
          }
          else {
            pcVar15 = "Unable to send NEWKEYS message ECDH";
          }
        }
        else {
          pcVar15 = "Unable to create ECDH shared secret";
LAB_001154f6:
          iVar5 = -5;
        }
      }
      else {
        pcVar15 = "Unexpected key length ECDH";
        iVar5 = -0xe;
      }
    }
    else {
      pcVar15 = "Unable to initialize hostkey importer ECDH";
LAB_00114979:
      iVar5 = -10;
    }
  }
  else {
    pcVar15 = "Unable to allocate memory for a copy of the host ECDH key";
LAB_00114847:
    iVar5 = -6;
  }
LAB_001154fc:
  iVar5 = _libssh2_error(session,iVar5,pcVar15);
switchD_001147f1_caseD_1:
  pkVar3 = local_78;
  BN_clear_free((BIGNUM *)local_78->k);
  pkVar3->k = (BIGNUM *)0x0;
  if (pkVar3->k_value != (uchar *)0x0) {
    (*session->free)(pkVar3->k_value,&session->abstract);
    pkVar3->k_value = (uchar *)0x0;
  }
  pkVar3->state = libssh2_NB_state_idle;
  return iVar5;
}

Assistant:

static int ecdh_sha2_nistp(LIBSSH2_SESSION *session, libssh2_curve_type type,
                           unsigned char *data, size_t data_len,
                           unsigned char *public_key,
                           size_t public_key_len, _libssh2_ec_key *private_key,
                           kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;

    if(data_len < 5) {
        ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                             "Host key data is too short");
        return ret;
    }

    if(exchange_state->state == libssh2_NB_state_idle) {

        /* Setup initial values */
        exchange_state->k = _libssh2_bn_init();

        exchange_state->state = libssh2_NB_state_created;
    }

    if(exchange_state->state == libssh2_NB_state_created) {
        /* parse INIT reply data */

        /* host key K_S */
        unsigned char *server_public_key;
        size_t server_public_key_len;
        struct string_buf buf;

        buf.data = data;
        buf.len = data_len;
        buf.dataptr = buf.data;
        buf.dataptr++; /* Advance past packet type */

        if(_libssh2_copy_string(session, &buf, &(session->server_hostkey),
                                &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host ECDH key");
            goto clean_exit;
        }

        session->server_hostkey_len = (uint32_t)server_public_key_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if(libssh2_md5_init(&fingerprint_ctx)) {
                libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len);
                libssh2_md5_final(fingerprint_ctx,
                                  session->server_hostkey_md5);
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if(libssh2_sha1_init(&fingerprint_ctx)) {
                libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                    session->server_hostkey_len);
                libssh2_sha1_final(fingerprint_ctx,
                                   session->server_hostkey_sha1);
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;
            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */

        /* SHA256 */
        {
            libssh2_sha256_ctx fingerprint_ctx;

            if(libssh2_sha256_init(&fingerprint_ctx)) {
                libssh2_sha256_update(fingerprint_ctx, session->server_hostkey,
                                      session->server_hostkey_len);
                libssh2_sha256_final(fingerprint_ctx,
                                     session->server_hostkey_sha256);
                session->server_hostkey_sha256_valid = TRUE;
            }
            else {
                session->server_hostkey_sha256_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char *base64Fingerprint = NULL;
            _libssh2_base64_encode(session,
                                   (const char *)
                                   session->server_hostkey_sha256,
                                   SHA256_DIGEST_LENGTH, &base64Fingerprint);
            if(base64Fingerprint) {
                _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                               "Server's SHA256 Fingerprint: %s",
                               base64Fingerprint));
                LIBSSH2_FREE(session, base64Fingerprint);
            }
        }
#endif /* LIBSSH2DEBUG */

        if(session->hostkey->init(session, session->server_hostkey,
                                  session->server_hostkey_len,
                                  &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer "
                                 "ECDH");
            goto clean_exit;
        }

        /* server public key Q_S */
        if(_libssh2_get_string(&buf, &server_public_key,
                               &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length ECDH");
            goto clean_exit;
        }

        /* server signature */
        if(_libssh2_get_string(&buf, &exchange_state->h_sig,
           &(exchange_state->h_sig_len))) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected ECDH server sig length");
            goto clean_exit;
        }

        /* Compute the shared secret K */
        rc = _libssh2_ecdh_gen_k(&exchange_state->k, private_key,
                                 server_public_key, server_public_key_len);
        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                 "Unable to create ECDH shared secret");
            goto clean_exit;
        }

        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
        LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if(!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for ECDH K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         (uint32_t)(exchange_state->k_value_len - 4));
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        }
        else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        /* verify hash */

        switch(type) {
            case LIBSSH2_EC_CURVE_NISTP256:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(256);
                break;

            case LIBSSH2_EC_CURVE_NISTP384:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(384);
                break;
            case LIBSSH2_EC_CURVE_NISTP521:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(512);
                break;
        }

        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature "
                                 "ECDH");
            goto clean_exit;
        }

        exchange_state->c = SSH_MSG_NEWKEYS;
        exchange_state->state = libssh2_NB_state_sent;
    }

    if(exchange_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send NEWKEYS message ECDH");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if(exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timed out waiting for NEWKEYS ECDH");
            goto clean_exit;
        }

        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Received NEWKEYS message ECDH"));

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if(!session->session_id) {

            size_t digest_length = 0;

            if(type == LIBSSH2_EC_CURVE_NISTP256)
                digest_length = SHA256_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP384)
                digest_length = SHA384_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP521)
                digest_length = SHA512_DIGEST_LENGTH;
            else{
                ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                     "Unknown SHA digest for EC curve");
                goto clean_exit;

            }
            session->session_id = LIBSSH2_ALLOC(session, digest_length);
            if(!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for "
                                     "SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   digest_length);
             session->session_id_len = (uint32_t)digest_length;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "session_id calculated"));
        }

        /* Cleanup any existing cipher */
        if(session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if(session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->local.crypt->
                                                 iv_len, "A");
            if(!iv) {
                ret = -1;
                goto clean_exit;
            }

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->local.crypt->
                                                 secret_len, "C");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated"));

        if(session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if(session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->remote.crypt->
                                                 iv_len, "B");

            if(!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->remote.crypt->
                                                 secret_len, "D");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated"));

        if(session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if(session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->local.mac->
                                                 key_len, "E");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated"));

        if(session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if(session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->remote.mac->
                                                 key_len, "F");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated"));

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if(session->local.comp && session->local.comp->init) {
            if(session->local.comp->init(session, 1,
                                         &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized"));

        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if(session->remote.comp && session->remote.comp->init) {
            if(session->remote.comp->init(session, 0,
                                          &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized"));
    }

clean_exit:
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;

    if(exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}